

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::seedRng(IConfig *config)

{
  int iVar1;
  uint __seed;
  long *in_RDI;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *unaff_retaddr;
  
  iVar1 = (**(code **)(*in_RDI + 0x80))();
  if (iVar1 != 0) {
    __seed = (**(code **)(*in_RDI + 0x80))();
    srand(__seed);
    rng();
    (**(code **)(*in_RDI + 0x80))();
    clara::std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::seed(unaff_retaddr,(result_type)in_RDI);
  }
  return;
}

Assistant:

void seedRng( IConfig const& config ) {
        if( config.rngSeed() != 0 ) {
            std::srand( config.rngSeed() );
            rng().seed( config.rngSeed() );
        }
    }